

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_separate_shader_objects(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_separate_shader_objects != 0) {
    glad_glUseShaderProgramEXT = (PFNGLUSESHADERPROGRAMEXTPROC)(*load)("glUseShaderProgramEXT");
    glad_glActiveProgramEXT = (PFNGLACTIVEPROGRAMEXTPROC)(*load)("glActiveProgramEXT");
    glad_glCreateShaderProgramEXT =
         (PFNGLCREATESHADERPROGRAMEXTPROC)(*load)("glCreateShaderProgramEXT");
    glad_glActiveShaderProgramEXT =
         (PFNGLACTIVESHADERPROGRAMEXTPROC)(*load)("glActiveShaderProgramEXT");
    glad_glBindProgramPipelineEXT =
         (PFNGLBINDPROGRAMPIPELINEEXTPROC)(*load)("glBindProgramPipelineEXT");
    glad_glCreateShaderProgramvEXT =
         (PFNGLCREATESHADERPROGRAMVEXTPROC)(*load)("glCreateShaderProgramvEXT");
    glad_glDeleteProgramPipelinesEXT =
         (PFNGLDELETEPROGRAMPIPELINESEXTPROC)(*load)("glDeleteProgramPipelinesEXT");
    glad_glGenProgramPipelinesEXT =
         (PFNGLGENPROGRAMPIPELINESEXTPROC)(*load)("glGenProgramPipelinesEXT");
    glad_glGetProgramPipelineInfoLogEXT =
         (PFNGLGETPROGRAMPIPELINEINFOLOGEXTPROC)(*load)("glGetProgramPipelineInfoLogEXT");
    glad_glGetProgramPipelineivEXT =
         (PFNGLGETPROGRAMPIPELINEIVEXTPROC)(*load)("glGetProgramPipelineivEXT");
    glad_glIsProgramPipelineEXT = (PFNGLISPROGRAMPIPELINEEXTPROC)(*load)("glIsProgramPipelineEXT");
    glad_glProgramParameteriEXT = (PFNGLPROGRAMPARAMETERIEXTPROC)(*load)("glProgramParameteriEXT");
    glad_glProgramUniform1fEXT = (PFNGLPROGRAMUNIFORM1FEXTPROC)(*load)("glProgramUniform1fEXT");
    glad_glProgramUniform1fvEXT = (PFNGLPROGRAMUNIFORM1FVEXTPROC)(*load)("glProgramUniform1fvEXT");
    glad_glProgramUniform1iEXT = (PFNGLPROGRAMUNIFORM1IEXTPROC)(*load)("glProgramUniform1iEXT");
    glad_glProgramUniform1ivEXT = (PFNGLPROGRAMUNIFORM1IVEXTPROC)(*load)("glProgramUniform1ivEXT");
    glad_glProgramUniform2fEXT = (PFNGLPROGRAMUNIFORM2FEXTPROC)(*load)("glProgramUniform2fEXT");
    glad_glProgramUniform2fvEXT = (PFNGLPROGRAMUNIFORM2FVEXTPROC)(*load)("glProgramUniform2fvEXT");
    glad_glProgramUniform2iEXT = (PFNGLPROGRAMUNIFORM2IEXTPROC)(*load)("glProgramUniform2iEXT");
    glad_glProgramUniform2ivEXT = (PFNGLPROGRAMUNIFORM2IVEXTPROC)(*load)("glProgramUniform2ivEXT");
    glad_glProgramUniform3fEXT = (PFNGLPROGRAMUNIFORM3FEXTPROC)(*load)("glProgramUniform3fEXT");
    glad_glProgramUniform3fvEXT = (PFNGLPROGRAMUNIFORM3FVEXTPROC)(*load)("glProgramUniform3fvEXT");
    glad_glProgramUniform3iEXT = (PFNGLPROGRAMUNIFORM3IEXTPROC)(*load)("glProgramUniform3iEXT");
    glad_glProgramUniform3ivEXT = (PFNGLPROGRAMUNIFORM3IVEXTPROC)(*load)("glProgramUniform3ivEXT");
    glad_glProgramUniform4fEXT = (PFNGLPROGRAMUNIFORM4FEXTPROC)(*load)("glProgramUniform4fEXT");
    glad_glProgramUniform4fvEXT = (PFNGLPROGRAMUNIFORM4FVEXTPROC)(*load)("glProgramUniform4fvEXT");
    glad_glProgramUniform4iEXT = (PFNGLPROGRAMUNIFORM4IEXTPROC)(*load)("glProgramUniform4iEXT");
    glad_glProgramUniform4ivEXT = (PFNGLPROGRAMUNIFORM4IVEXTPROC)(*load)("glProgramUniform4ivEXT");
    glad_glProgramUniformMatrix2fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2FVEXTPROC)(*load)("glProgramUniformMatrix2fvEXT");
    glad_glProgramUniformMatrix3fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3FVEXTPROC)(*load)("glProgramUniformMatrix3fvEXT");
    glad_glProgramUniformMatrix4fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4FVEXTPROC)(*load)("glProgramUniformMatrix4fvEXT");
    glad_glUseProgramStagesEXT = (PFNGLUSEPROGRAMSTAGESEXTPROC)(*load)("glUseProgramStagesEXT");
    glad_glValidateProgramPipelineEXT =
         (PFNGLVALIDATEPROGRAMPIPELINEEXTPROC)(*load)("glValidateProgramPipelineEXT");
    glad_glProgramUniform1uiEXT = (PFNGLPROGRAMUNIFORM1UIEXTPROC)(*load)("glProgramUniform1uiEXT");
    glad_glProgramUniform2uiEXT = (PFNGLPROGRAMUNIFORM2UIEXTPROC)(*load)("glProgramUniform2uiEXT");
    glad_glProgramUniform3uiEXT = (PFNGLPROGRAMUNIFORM3UIEXTPROC)(*load)("glProgramUniform3uiEXT");
    glad_glProgramUniform4uiEXT = (PFNGLPROGRAMUNIFORM4UIEXTPROC)(*load)("glProgramUniform4uiEXT");
    glad_glProgramUniform1uivEXT =
         (PFNGLPROGRAMUNIFORM1UIVEXTPROC)(*load)("glProgramUniform1uivEXT");
    glad_glProgramUniform2uivEXT =
         (PFNGLPROGRAMUNIFORM2UIVEXTPROC)(*load)("glProgramUniform2uivEXT");
    glad_glProgramUniform3uivEXT =
         (PFNGLPROGRAMUNIFORM3UIVEXTPROC)(*load)("glProgramUniform3uivEXT");
    glad_glProgramUniform4uivEXT =
         (PFNGLPROGRAMUNIFORM4UIVEXTPROC)(*load)("glProgramUniform4uivEXT");
    glad_glProgramUniformMatrix2x3fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2X3FVEXTPROC)(*load)("glProgramUniformMatrix2x3fvEXT");
    glad_glProgramUniformMatrix3x2fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3X2FVEXTPROC)(*load)("glProgramUniformMatrix3x2fvEXT");
    glad_glProgramUniformMatrix2x4fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2X4FVEXTPROC)(*load)("glProgramUniformMatrix2x4fvEXT");
    glad_glProgramUniformMatrix4x2fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4X2FVEXTPROC)(*load)("glProgramUniformMatrix4x2fvEXT");
    glad_glProgramUniformMatrix3x4fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3X4FVEXTPROC)(*load)("glProgramUniformMatrix3x4fvEXT");
    glad_glProgramUniformMatrix4x3fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4X3FVEXTPROC)(*load)("glProgramUniformMatrix4x3fvEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_separate_shader_objects(GLADloadproc load) {
	if(!GLAD_GL_EXT_separate_shader_objects) return;
	glad_glUseShaderProgramEXT = (PFNGLUSESHADERPROGRAMEXTPROC)load("glUseShaderProgramEXT");
	glad_glActiveProgramEXT = (PFNGLACTIVEPROGRAMEXTPROC)load("glActiveProgramEXT");
	glad_glCreateShaderProgramEXT = (PFNGLCREATESHADERPROGRAMEXTPROC)load("glCreateShaderProgramEXT");
	glad_glActiveShaderProgramEXT = (PFNGLACTIVESHADERPROGRAMEXTPROC)load("glActiveShaderProgramEXT");
	glad_glBindProgramPipelineEXT = (PFNGLBINDPROGRAMPIPELINEEXTPROC)load("glBindProgramPipelineEXT");
	glad_glCreateShaderProgramvEXT = (PFNGLCREATESHADERPROGRAMVEXTPROC)load("glCreateShaderProgramvEXT");
	glad_glDeleteProgramPipelinesEXT = (PFNGLDELETEPROGRAMPIPELINESEXTPROC)load("glDeleteProgramPipelinesEXT");
	glad_glGenProgramPipelinesEXT = (PFNGLGENPROGRAMPIPELINESEXTPROC)load("glGenProgramPipelinesEXT");
	glad_glGetProgramPipelineInfoLogEXT = (PFNGLGETPROGRAMPIPELINEINFOLOGEXTPROC)load("glGetProgramPipelineInfoLogEXT");
	glad_glGetProgramPipelineivEXT = (PFNGLGETPROGRAMPIPELINEIVEXTPROC)load("glGetProgramPipelineivEXT");
	glad_glIsProgramPipelineEXT = (PFNGLISPROGRAMPIPELINEEXTPROC)load("glIsProgramPipelineEXT");
	glad_glProgramParameteriEXT = (PFNGLPROGRAMPARAMETERIEXTPROC)load("glProgramParameteriEXT");
	glad_glProgramUniform1fEXT = (PFNGLPROGRAMUNIFORM1FEXTPROC)load("glProgramUniform1fEXT");
	glad_glProgramUniform1fvEXT = (PFNGLPROGRAMUNIFORM1FVEXTPROC)load("glProgramUniform1fvEXT");
	glad_glProgramUniform1iEXT = (PFNGLPROGRAMUNIFORM1IEXTPROC)load("glProgramUniform1iEXT");
	glad_glProgramUniform1ivEXT = (PFNGLPROGRAMUNIFORM1IVEXTPROC)load("glProgramUniform1ivEXT");
	glad_glProgramUniform2fEXT = (PFNGLPROGRAMUNIFORM2FEXTPROC)load("glProgramUniform2fEXT");
	glad_glProgramUniform2fvEXT = (PFNGLPROGRAMUNIFORM2FVEXTPROC)load("glProgramUniform2fvEXT");
	glad_glProgramUniform2iEXT = (PFNGLPROGRAMUNIFORM2IEXTPROC)load("glProgramUniform2iEXT");
	glad_glProgramUniform2ivEXT = (PFNGLPROGRAMUNIFORM2IVEXTPROC)load("glProgramUniform2ivEXT");
	glad_glProgramUniform3fEXT = (PFNGLPROGRAMUNIFORM3FEXTPROC)load("glProgramUniform3fEXT");
	glad_glProgramUniform3fvEXT = (PFNGLPROGRAMUNIFORM3FVEXTPROC)load("glProgramUniform3fvEXT");
	glad_glProgramUniform3iEXT = (PFNGLPROGRAMUNIFORM3IEXTPROC)load("glProgramUniform3iEXT");
	glad_glProgramUniform3ivEXT = (PFNGLPROGRAMUNIFORM3IVEXTPROC)load("glProgramUniform3ivEXT");
	glad_glProgramUniform4fEXT = (PFNGLPROGRAMUNIFORM4FEXTPROC)load("glProgramUniform4fEXT");
	glad_glProgramUniform4fvEXT = (PFNGLPROGRAMUNIFORM4FVEXTPROC)load("glProgramUniform4fvEXT");
	glad_glProgramUniform4iEXT = (PFNGLPROGRAMUNIFORM4IEXTPROC)load("glProgramUniform4iEXT");
	glad_glProgramUniform4ivEXT = (PFNGLPROGRAMUNIFORM4IVEXTPROC)load("glProgramUniform4ivEXT");
	glad_glProgramUniformMatrix2fvEXT = (PFNGLPROGRAMUNIFORMMATRIX2FVEXTPROC)load("glProgramUniformMatrix2fvEXT");
	glad_glProgramUniformMatrix3fvEXT = (PFNGLPROGRAMUNIFORMMATRIX3FVEXTPROC)load("glProgramUniformMatrix3fvEXT");
	glad_glProgramUniformMatrix4fvEXT = (PFNGLPROGRAMUNIFORMMATRIX4FVEXTPROC)load("glProgramUniformMatrix4fvEXT");
	glad_glUseProgramStagesEXT = (PFNGLUSEPROGRAMSTAGESEXTPROC)load("glUseProgramStagesEXT");
	glad_glValidateProgramPipelineEXT = (PFNGLVALIDATEPROGRAMPIPELINEEXTPROC)load("glValidateProgramPipelineEXT");
	glad_glProgramUniform1uiEXT = (PFNGLPROGRAMUNIFORM1UIEXTPROC)load("glProgramUniform1uiEXT");
	glad_glProgramUniform2uiEXT = (PFNGLPROGRAMUNIFORM2UIEXTPROC)load("glProgramUniform2uiEXT");
	glad_glProgramUniform3uiEXT = (PFNGLPROGRAMUNIFORM3UIEXTPROC)load("glProgramUniform3uiEXT");
	glad_glProgramUniform4uiEXT = (PFNGLPROGRAMUNIFORM4UIEXTPROC)load("glProgramUniform4uiEXT");
	glad_glProgramUniform1uivEXT = (PFNGLPROGRAMUNIFORM1UIVEXTPROC)load("glProgramUniform1uivEXT");
	glad_glProgramUniform2uivEXT = (PFNGLPROGRAMUNIFORM2UIVEXTPROC)load("glProgramUniform2uivEXT");
	glad_glProgramUniform3uivEXT = (PFNGLPROGRAMUNIFORM3UIVEXTPROC)load("glProgramUniform3uivEXT");
	glad_glProgramUniform4uivEXT = (PFNGLPROGRAMUNIFORM4UIVEXTPROC)load("glProgramUniform4uivEXT");
	glad_glProgramUniformMatrix2x3fvEXT = (PFNGLPROGRAMUNIFORMMATRIX2X3FVEXTPROC)load("glProgramUniformMatrix2x3fvEXT");
	glad_glProgramUniformMatrix3x2fvEXT = (PFNGLPROGRAMUNIFORMMATRIX3X2FVEXTPROC)load("glProgramUniformMatrix3x2fvEXT");
	glad_glProgramUniformMatrix2x4fvEXT = (PFNGLPROGRAMUNIFORMMATRIX2X4FVEXTPROC)load("glProgramUniformMatrix2x4fvEXT");
	glad_glProgramUniformMatrix4x2fvEXT = (PFNGLPROGRAMUNIFORMMATRIX4X2FVEXTPROC)load("glProgramUniformMatrix4x2fvEXT");
	glad_glProgramUniformMatrix3x4fvEXT = (PFNGLPROGRAMUNIFORMMATRIX3X4FVEXTPROC)load("glProgramUniformMatrix3x4fvEXT");
	glad_glProgramUniformMatrix4x3fvEXT = (PFNGLPROGRAMUNIFORMMATRIX4X3FVEXTPROC)load("glProgramUniformMatrix4x3fvEXT");
}